

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuBilinearImageCompare.cpp
# Opt level: O0

deUint8 tcu::anon_unknown_0::interpolateChannel
                  (deUint32 fx1,deUint32 fy1,deUint8 p00,deUint8 p01,deUint8 p10,deUint8 p11)

{
  deUint32 rounded;
  deUint32 sum;
  deUint32 half;
  deUint32 fy0;
  deUint32 fx0;
  deUint8 p11_local;
  deUint8 p10_local;
  deUint8 p01_local;
  deUint8 p00_local;
  deUint32 fy1_local;
  deUint32 fx1_local;
  
  return (deUint8)((0x100 - fx1) * (0x100 - fy1) * (uint)p00 + fx1 * (0x100 - fy1) * (uint)p10 +
                   (0x100 - fx1) * fy1 * (uint)p01 + fx1 * fy1 * (uint)p11 + 0x8000 >> 0x10);
}

Assistant:

inline deUint8 interpolateChannel (deUint32 fx1, deUint32 fy1, deUint8 p00, deUint8 p01, deUint8 p10, deUint8 p11)
{
	const deUint32 fx0		= (1u<<NUM_SUBPIXEL_BITS) - fx1;
	const deUint32 fy0		= (1u<<NUM_SUBPIXEL_BITS) - fy1;
	const deUint32 half		= 1u<<(NUM_SUBPIXEL_BITS*2 - 1);
	const deUint32 sum		= fx0*fy0*p00 + fx1*fy0*p10 + fx0*fy1*p01 + fx1*fy1*p11;
	const deUint32 rounded	= (sum + half) >> (NUM_SUBPIXEL_BITS*2);

	DE_ASSERT(de::inRange<deUint32>(rounded, 0, 0xff));
	return (deUint8)rounded;
}